

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddCorr.c
# Opt level: O1

double Cudd_bddCorrelation(DdManager *manager,DdNode *f,DdNode *g)

{
  st__table *table;
  double dVar1;
  
  table = st__init_table(CorrelCompare,CorrelHash);
  if (table == (st__table *)0x0) {
    dVar1 = -1.0;
  }
  else {
    dVar1 = bddCorrelationAux(manager,f,g,table);
    st__foreach(table,CorrelCleanUp,(char *)0x0);
    st__free_table(table);
  }
  return dVar1;
}

Assistant:

double
Cudd_bddCorrelation(
  DdManager * manager,
  DdNode * f,
  DdNode * g)
{

    st__table    *table;
    double      correlation;

#ifdef CORREL_STATS
    num_calls = 0;
#endif

    table = st__init_table(CorrelCompare,CorrelHash);
    if (table == NULL) return((double)CUDD_OUT_OF_MEM);
    correlation = bddCorrelationAux(manager,f,g,table);
    st__foreach(table, CorrelCleanUp, NIL(char));
    st__free_table(table);
    return(correlation);

}